

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

void __thiscall rsg::ValueRange::~ValueRange(ValueRange *this)

{
  std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
            (&(this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>);
  std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
            (&(this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>);
  VariableType::~VariableType(&this->m_type);
  return;
}

Assistant:

ValueRange::~ValueRange (void)
{
}